

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int bgzf_index_dump(BGZF *fp,char *bname,char *suffix)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  char *local_60;
  long local_58;
  uint64_t x_1;
  uint64_t x;
  FILE *pFStack_40;
  int i;
  FILE *idx;
  int slen;
  int blen;
  char *tmp;
  char *suffix_local;
  char *bname_local;
  BGZF *fp_local;
  
  tmp = suffix;
  suffix_local = bname;
  bname_local = (char *)fp;
  iVar1 = bgzf_flush(fp);
  if (iVar1 == 0) {
    if (*(long *)(bname_local + 0x48) == 0) {
      __assert_fail("fp->idx",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/bgzf.c"
                    ,0x3cc,"int bgzf_index_dump(BGZF *, const char *, const char *)");
    }
    _slen = (char *)0x0;
    if (tmp != (char *)0x0) {
      sVar2 = strlen(suffix_local);
      idx._4_4_ = (int)sVar2;
      sVar2 = strlen(tmp);
      idx._0_4_ = (int)sVar2;
      _slen = (char *)malloc((long)(idx._4_4_ + (int)idx + 1));
      if (_slen == (char *)0x0) {
        return -1;
      }
      memcpy(_slen,suffix_local,(long)idx._4_4_);
      memcpy(_slen + idx._4_4_,tmp,(long)((int)idx + 1));
    }
    if (_slen == (char *)0x0) {
      local_60 = suffix_local;
    }
    else {
      local_60 = _slen;
    }
    pFStack_40 = fopen(local_60,"wb");
    if (_slen != (char *)0x0) {
      free(_slen);
    }
    if (pFStack_40 == (FILE *)0x0) {
      fp_local._4_4_ = -1;
    }
    else {
      if ((*(int *)bname_local << 0xc) >> 0x1e == 0) {
        local_58 = (long)(**(int **)(bname_local + 0x48) + -1);
        fwrite(&local_58,1,8,pFStack_40);
        for (x._4_4_ = 1; x._4_4_ < **(int **)(bname_local + 0x48); x._4_4_ = x._4_4_ + 1) {
          fwrite((void *)(*(long *)(*(long *)(bname_local + 0x48) + 8) + (long)x._4_4_ * 0x10 + 8),1
                 ,8,pFStack_40);
          fwrite((void *)(*(long *)(*(long *)(bname_local + 0x48) + 8) + (long)x._4_4_ * 0x10),1,8,
                 pFStack_40);
        }
      }
      else {
        x_1 = (uint64_t)(**(int **)(bname_local + 0x48) + -1);
        pvVar3 = ed_swap_8p(&x_1);
        fwrite(pvVar3,1,8,pFStack_40);
        for (x._4_4_ = 1; x._4_4_ < **(int **)(bname_local + 0x48); x._4_4_ = x._4_4_ + 1) {
          x_1 = *(uint64_t *)
                 (*(long *)(*(long *)(bname_local + 0x48) + 8) + (long)x._4_4_ * 0x10 + 8);
          pvVar3 = ed_swap_8p(&x_1);
          fwrite(pvVar3,1,8,pFStack_40);
          x_1 = *(uint64_t *)(*(long *)(*(long *)(bname_local + 0x48) + 8) + (long)x._4_4_ * 0x10);
          pvVar3 = ed_swap_8p(&x_1);
          fwrite(pvVar3,1,8,pFStack_40);
        }
      }
      fclose(pFStack_40);
      fp_local._4_4_ = 0;
    }
  }
  else {
    fp_local._4_4_ = -1;
  }
  return fp_local._4_4_;
}

Assistant:

int bgzf_index_dump(BGZF *fp, const char *bname, const char *suffix)
{
    if (bgzf_flush(fp) != 0) return -1;

    assert(fp->idx);
    char *tmp = NULL;
    if ( suffix )
    {
        int blen = strlen(bname);
        int slen = strlen(suffix);
        tmp = (char*) malloc(blen + slen + 1);
        if ( !tmp ) return -1;
        memcpy(tmp,bname,blen);
        memcpy(tmp+blen,suffix,slen+1);
    }

    FILE *idx = fopen(tmp?tmp:bname,"wb");
    if ( tmp ) free(tmp);
    if ( !idx ) return -1;

    // Note that the index contains one extra record when indexing files opened
    // for reading. The terminating record is not present when opened for writing.
    // This is not a bug.

    int i;
    if ( fp->is_be )
    {
        uint64_t x = fp->idx->noffs - 1;
        fwrite(ed_swap_8p(&x), 1, sizeof(x), idx);
        for (i=1; i<fp->idx->noffs; i++)
        {
            x = fp->idx->offs[i].caddr; fwrite(ed_swap_8p(&x), 1, sizeof(x), idx);
            x = fp->idx->offs[i].uaddr; fwrite(ed_swap_8p(&x), 1, sizeof(x), idx);
        }
    }
    else
    {
        uint64_t x = fp->idx->noffs - 1;
        fwrite(&x, 1, sizeof(x), idx);
        for (i=1; i<fp->idx->noffs; i++)
        {
            fwrite(&fp->idx->offs[i].caddr, 1, sizeof(fp->idx->offs[i].caddr), idx);
            fwrite(&fp->idx->offs[i].uaddr, 1, sizeof(fp->idx->offs[i].uaddr), idx);
        }
    }
    fclose(idx);
    return 0;
}